

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall
ExprTest_ExprIterator_Test::~ExprTest_ExprIterator_Test(ExprTest_ExprIterator_Test *this)

{
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_001a4a58;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory(&(this->super_ExprTest).factory_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, ExprIterator) {
  enum {NUM_ARGS = 3};
  mp::Function f = factory_.AddFunction("foo", NUM_ARGS);
  ExprFactory::CallExprBuilder builder = factory_.BeginCall(f, NUM_ARGS);
  Expr args[NUM_ARGS] = {
    factory_.MakeNumericConstant(11),
    factory_.MakeVariable(0),
    factory_.MakeNumericConstant(22)
  };
  for (int i = 0; i < NUM_ARGS; ++i)
    builder.AddArg(args[i]);
  auto e = factory_.EndCall(builder);
  mp::CallExpr::iterator i = e.begin();
  EXPECT_EQ(args[0], *i);
  EXPECT_EQ(expr::NUMBER, i->kind());
  EXPECT_EQ(mp::CallExpr::iterator(e.begin()), i);
  auto j = i;
  EXPECT_TRUE(i == j);
  j = i++;
  EXPECT_TRUE(i != j);
  EXPECT_EQ(args[0], *j);
  EXPECT_EQ(args[1], *i);
  j = ++i;
  EXPECT_EQ(j, i);
  EXPECT_EQ(args[2], *i);
}